

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::ray_tracing_khr_fixup_locations(CompilerGLSL *this)

{
  anon_class_16_2_a434c5f0 local_28;
  uint32_t local_14;
  CompilerGLSL *pCStack_10;
  uint32_t location;
  CompilerGLSL *this_local;
  
  local_14 = 0;
  local_28.location = &local_14;
  local_28.this = this;
  pCStack_10 = this;
  ParsedIR::
  for_each_typed_id<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::CompilerGLSL::ray_tracing_khr_fixup_locations()::__0>
            (&(this->super_Compiler).ir,&local_28);
  return;
}

Assistant:

void CompilerGLSL::ray_tracing_khr_fixup_locations()
{
	uint32_t location = 0;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// Incoming payload storage can also be used for tracing.
		if (var.storage != StorageClassRayPayloadKHR && var.storage != StorageClassCallableDataKHR &&
		    var.storage != StorageClassIncomingRayPayloadKHR && var.storage != StorageClassIncomingCallableDataKHR)
			return;
		if (is_hidden_variable(var))
			return;
		set_decoration(var.self, DecorationLocation, location++);
	});
}